

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

void __thiscall
EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
          (EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *this)

{
  dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  *pdVar1;
  key_type local_18;
  
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = false;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.num_deleted = 0;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.num_elements = 0;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.num_buckets = 0x20;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.table = (pointer)0x0;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ = 0x10;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 6;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_empty_
       = false;
  local_18.i_ = -1;
  local_18.buffer_[0] = -1;
  local_18.buffer_[1] = -1;
  local_18.buffer_[2] = -1;
  local_18.buffer_[3] = -1;
  google::
  dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::set_empty_key((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                   *)this,&local_18);
  google::
  dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::squash_deleted((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                    *)this);
  (this->
  super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ).rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = true;
  g_num_copies = g_num_copies + 1;
  pdVar1 = &this->
            super_dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ;
  (pdVar1->rep).key_info.delkey.i_ = -2;
  (pdVar1->rep).key_info.delkey.buffer_[0] = -2;
  (pdVar1->rep).key_info.delkey.buffer_[1] = -2;
  (pdVar1->rep).key_info.delkey.buffer_[2] = -2;
  (pdVar1->rep).key_info.delkey.buffer_[3] = -2;
  return;
}

Assistant:

EasyUseDenseHashMap() {
    this->set_empty_key(-1);
    this->set_deleted_key(-2);
  }